

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void accumulate(ProcessResult *r,ProcessResult *term)

{
  ProcessResult *term_local;
  ProcessResult *r_local;
  
  r->total = term->total + r->total;
  r->replaced_path = term->replaced_path + r->replaced_path;
  r->system_to_user = term->system_to_user + r->system_to_user;
  r->user_to_system = term->user_to_system + r->user_to_system;
  r->untouched = term->untouched + r->untouched;
  r->failed = term->failed + r->failed;
  return;
}

Assistant:

void accumulate(ProcessResult *r, const ProcessResult &term) {
  r->total += term.total;
  r->replaced_path += term.replaced_path;
  r->system_to_user += term.system_to_user;
  r->user_to_system += term.user_to_system;
  r->untouched += term.untouched;
  r->failed += term.failed;
}